

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

ssize_t __thiscall vox::nSHP::write(nSHP *this,int __fd,void *__buf,size_t __n)

{
  reference this_00;
  FILE *__n_00;
  nSHP *__n_01;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  uint local_34;
  undefined8 uStack_30;
  int i;
  size_t childSize;
  size_t contentSize;
  FILE *pFStack_18;
  int32_t id;
  FILE *fp_local;
  nSHP *this_local;
  
  pFStack_18 = (FILE *)CONCAT44(in_register_00000034,__fd);
  fp_local = (FILE *)this;
  contentSize._4_4_ = GetMVID('n','S','H','P');
  fwrite((void *)((long)&contentSize + 4),4,1,pFStack_18);
  childSize = getSize(this);
  fwrite(&childSize,4,1,pFStack_18);
  uStack_30 = 0;
  fwrite(&stack0xffffffffffffffd0,4,1,pFStack_18);
  __n_00 = pFStack_18;
  fwrite(this,4,1,pFStack_18);
  DICT::write(&this->nodeAttribs,(int)pFStack_18,__buf_00,(size_t)__n_00);
  fwrite(&this->numModels,4,1,pFStack_18);
  local_34 = 0;
  while( true ) {
    if (this->numModels <= (int)local_34) break;
    __n_01 = this;
    this_00 = std::vector<vox::MODEL,_std::allocator<vox::MODEL>_>::operator[]
                        (&this->models,(long)(int)local_34);
    MODEL::write(this_00,(int)pFStack_18,__buf_01,(size_t)__n_01);
    local_34 = local_34 + 1;
  }
  return (ulong)local_34;
}

Assistant:

void nSHP::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('n', 'S', 'H', 'P');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&nodeId, sizeof(int32_t), 1, fp);
    nodeAttribs.write(fp);
    fwrite(&numModels, sizeof(int32_t), 1, fp);
    for (int i = 0; i < numModels; i++)
        models[i].write(fp);
}